

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall
tetgenmesh::hilbert_sort3
          (tetgenmesh *this,point *vertexarray,int arraysize,int e,int d,double bxmin,double bxmax,
          double bymin,double bymax,double bzmin,double bzmax,int depth)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  uint uVar7;
  int *piVar8;
  tetgenmesh *this_00;
  ulong uVar9;
  double bxmin_00;
  double dVar10;
  double dVar11;
  double dVar12;
  double bxmax_00;
  double bymin_00;
  double bymax_00;
  double bzmin_00;
  double bzmax_00;
  int p [9];
  
  p[0] = 0;
  this_00 = this;
  p[8] = arraysize;
  iVar2 = hilbert_split(this,vertexarray,arraysize,this->transgc[e][d][3],this->transgc[e][d][4],
                        bxmin,bxmax,bymin,bymax,bzmin,bzmax);
  p[4] = iVar2;
  iVar3 = hilbert_split(this_00,vertexarray,iVar2,this->transgc[e][d][1],this->transgc[e][d][2],
                        bxmin,bxmax,bymin,bymax,bzmin,bzmax);
  p[2] = iVar3;
  p[1] = hilbert_split(this_00,vertexarray,iVar3,this->transgc[e][d][0],this->transgc[e][d][1],bxmin
                       ,bxmax,bymin,bymax,bzmin,bzmax);
  iVar4 = hilbert_split(this_00,vertexarray + iVar3,iVar2 - iVar3,this->transgc[e][d][2],
                        this->transgc[e][d][3],bxmin,bxmax,bymin,bymax,bzmin,bzmax);
  p[3] = iVar4 + iVar3;
  iVar3 = hilbert_split(this_00,vertexarray + iVar2,arraysize - iVar2,this->transgc[e][d][5],
                        this->transgc[e][d][6],bxmin,bxmax,bymin,bymax,bzmin,bzmax);
  iVar4 = iVar3 + iVar2;
  p[6] = iVar4;
  iVar3 = hilbert_split(this_00,vertexarray + iVar2,iVar3,this->transgc[e][d][4],
                        this->transgc[e][d][5],bxmin,bxmax,bymin,bymax,bzmin,bzmax);
  p[5] = iVar3 + iVar2;
  iVar2 = hilbert_split(this_00,vertexarray + iVar4,arraysize - iVar4,this->transgc[e][d][6],
                        this->transgc[e][d][7],bxmin,bxmax,bymin,bymax,bzmin,bzmax);
  p[7] = iVar2 + iVar4;
  iVar2 = this->b->hilbert_order;
  if (iVar2 < 1 || depth + 1 != iVar2) {
    dVar10 = (bxmin + bxmax) * 0.5;
    dVar11 = (bymin + bymax) * 0.5;
    dVar12 = (bzmin + bzmax) * 0.5;
    piVar8 = this->transgc[7][2] + 7;
    iVar2 = 0;
    for (uVar9 = 0; uVar9 != 8; uVar9 = uVar9 + 1) {
      iVar3 = p[uVar9 + 1];
      iVar4 = iVar3 - iVar2;
      if (this->b->hilbert_limit < iVar4) {
        iVar5 = 0;
        uVar7 = 0;
        if (uVar9 != 0) {
          uVar7 = (int)uVar9 - 1U >> 1 & 0x7f;
          uVar7 = uVar7 * 2 ^ uVar7;
        }
        if (uVar9 != 0) {
          piVar6 = piVar8 + 1;
          if ((uVar9 & 1) == 0) {
            piVar6 = piVar8;
          }
          iVar5 = *piVar6;
        }
        uVar1 = this->transgc[e][d][uVar9];
        bxmin_00 = bxmin;
        bxmax_00 = dVar10;
        if ((uVar1 & 1) != 0) {
          bxmin_00 = dVar10;
          bxmax_00 = bxmax;
        }
        bymin_00 = bymin;
        bymax_00 = dVar11;
        if ((uVar1 & 2) != 0) {
          bymin_00 = dVar11;
          bymax_00 = bymax;
        }
        bzmin_00 = bzmin;
        bzmax_00 = dVar12;
        if ((uVar1 & 4) != 0) {
          bzmin_00 = dVar12;
          bzmax_00 = bzmax;
        }
        hilbert_sort3(this,vertexarray + iVar2,iVar4,
                      (uVar7 << ((byte)(d + 1) & 0x1f) | uVar7 >> (2U - (char)d & 0x1f)) & 7 ^ e,
                      (iVar5 + d + 1) % 3,bxmin_00,bxmax_00,bymin_00,bymax_00,bzmin_00,bzmax_00,
                      depth + 1);
      }
      piVar8 = piVar8 + 1;
      iVar2 = iVar3;
    }
  }
  return;
}

Assistant:

void tetgenmesh::hilbert_sort3(point* vertexarray, int arraysize, int e, int d, 
                               REAL bxmin, REAL bxmax, REAL bymin, REAL bymax, 
                               REAL bzmin, REAL bzmax, int depth)
{
  REAL x1, x2, y1, y2, z1, z2;
  int p[9], w, e_w, d_w, k, ei, di;
  int n = 3, mask = 7;

  p[0] = 0;
  p[8] = arraysize;

  // Sort the points according to the 1st order Hilbert curve in 3d.
  p[4] = hilbert_split(vertexarray, p[8], transgc[e][d][3], transgc[e][d][4], 
                       bxmin, bxmax, bymin, bymax, bzmin, bzmax);
  p[2] = hilbert_split(vertexarray, p[4], transgc[e][d][1], transgc[e][d][2], 
                       bxmin, bxmax, bymin, bymax, bzmin, bzmax);
  p[1] = hilbert_split(vertexarray, p[2], transgc[e][d][0], transgc[e][d][1], 
                       bxmin, bxmax, bymin, bymax, bzmin, bzmax);
  p[3] = hilbert_split(&(vertexarray[p[2]]), p[4] - p[2], 
                       transgc[e][d][2], transgc[e][d][3], 
                       bxmin, bxmax, bymin, bymax, bzmin, bzmax) + p[2];
  p[6] = hilbert_split(&(vertexarray[p[4]]), p[8] - p[4], 
                       transgc[e][d][5], transgc[e][d][6], 
                       bxmin, bxmax, bymin, bymax, bzmin, bzmax) + p[4];
  p[5] = hilbert_split(&(vertexarray[p[4]]), p[6] - p[4], 
                       transgc[e][d][4], transgc[e][d][5], 
                       bxmin, bxmax, bymin, bymax, bzmin, bzmax) + p[4];
  p[7] = hilbert_split(&(vertexarray[p[6]]), p[8] - p[6], 
                       transgc[e][d][6], transgc[e][d][7], 
                       bxmin, bxmax, bymin, bymax, bzmin, bzmax) + p[6];

  if (b->hilbert_order > 0) {
    // A maximum order is prescribed. 
    if ((depth + 1) == b->hilbert_order) {
      // The maximum prescribed order is reached.
      return;
    }
  }

  // Recursively sort the points in sub-boxes.
  for (w = 0; w < 8; w++) {
    // w is the local Hilbert index (NOT Gray code).
    // Sort into the sub-box either there are more than 2 points in it, or
    //   the prescribed order of the curve is not reached yet.
    //if ((p[w+1] - p[w] > b->hilbert_limit) || (b->hilbert_order > 0)) {
    if ((p[w+1] - p[w]) > b->hilbert_limit) {
      // Calculcate the start point (ei) of the curve in this sub-box.
      //   update e = e ^ (e(w) left_rotate (d+1)).
      if (w == 0) {
        e_w = 0;
      } else {
        //   calculate e(w) = gc(2 * floor((w - 1) / 2)).
        k = 2 * ((w - 1) / 2); 
        e_w = k ^ (k >> 1); // = gc(k).
      }
      k = e_w;
      e_w = ((k << (d+1)) & mask) | ((k >> (n-d-1)) & mask);
      ei = e ^ e_w;
      // Calulcate the direction (di) of the curve in this sub-box.
      //   update d = (d + d(w) + 1) % n
      if (w == 0) {
        d_w = 0;
      } else {
        d_w = ((w % 2) == 0) ? tsb1mod3[w - 1] : tsb1mod3[w];
      }
      di = (d + d_w + 1) % n;
      // Calculate the bounding box of the sub-box.
      if (transgc[e][d][w] & 1) { // x-axis
        x1 = 0.5 * (bxmin + bxmax);
        x2 = bxmax;
      } else {
        x1 = bxmin;
        x2 = 0.5 * (bxmin + bxmax);
      }
      if (transgc[e][d][w] & 2) { // y-axis
        y1 = 0.5 * (bymin + bymax);
        y2 = bymax;
      } else {
        y1 = bymin;
        y2 = 0.5 * (bymin + bymax);
      }
      if (transgc[e][d][w] & 4) { // z-axis
        z1 = 0.5 * (bzmin + bzmax);
        z2 = bzmax;
      } else {
        z1 = bzmin;
        z2 = 0.5 * (bzmin + bzmax);
      }
      hilbert_sort3(&(vertexarray[p[w]]), p[w+1] - p[w], ei, di, 
                    x1, x2, y1, y2, z1, z2, depth+1);
    } // if (p[w+1] - p[w] > 1)
  } // w
}